

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O1

void __thiscall
Omega_h::MetricEdgeLengths<2,_2>::MetricEdgeLengths(MetricEdgeLengths<2,_2> *this,Mesh *mesh)

{
  int *piVar1;
  undefined1 local_50 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_40._M_pi = &local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"metric","");
  Omega_h::Mesh::get_array<double>((Mesh *)local_50,(Int)mesh,(string *)0x0);
  MetricEdgeLengths(this,mesh,(Reals *)local_50);
  if ((local_50._0_8_ & 7) == 0 && (Alloc *)local_50._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_50._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_50._0_8_);
      operator_delete((void *)local_50._0_8_,0x48);
    }
  }
  if (local_40._M_pi != &local_30) {
    operator_delete(local_40._M_pi,(long)local_30._vptr__Sp_counted_base + 1);
  }
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh)
      : MetricEdgeLengths(mesh, mesh->get_array<Real>(VERT, "metric")) {}